

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(uchar lhs,
         SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  unsigned_long_long in_RSI;
  uchar in_DIL;
  uchar ret;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  unsigned_long_long *in_stack_ffffffffffffffb8;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffc0;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  uchar local_11;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  unsigned_long_long local_8;
  
  local_11 = in_DIL;
  local_10.m_int = in_RSI;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            (&local_20);
  bVar1 = DivisionCornerCaseHelper<unsigned_long_long,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1(local_11,local_10,&local_20);
  if (bVar1) {
    local_8 = local_20.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<unsigned_long_long,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::DivisionCornerCase2(local_11,local_10,&local_20);
    if (bVar1) {
      local_8 = local_20.m_int;
    }
    else {
      this = (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             SafeInt::operator_cast_to_unsigned_long_long(in_stack_ffffffffffffffc0);
      DivisionHelper<unsigned_char,_unsigned_long_long,_0>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((uchar *)this,in_stack_ffffffffffffffb8,(uchar *)0x211e66);
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<unsigned_char>(this,(uchar *)in_stack_ffffffffffffffb8);
    }
  }
  return (SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_8;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}